

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int upb_JsonDecodeDetectingNonconformance
              (char *buf,size_t size,upb_Message *msg,upb_MessageDef *m,upb_DefPool *symtab,
              int options,upb_Arena *arena,upb_Status *status)

{
  _Bool _Var1;
  undefined1 local_158 [8];
  jsondec d;
  int options_local;
  upb_DefPool *symtab_local;
  upb_MessageDef *m_local;
  upb_Message *msg_local;
  size_t size_local;
  char *buf_local;
  
  d.debug_field._4_4_ = options;
  _Var1 = upb_Message_IsFrozen(msg);
  if (!_Var1) {
    if (size == 0) {
      buf_local._4_4_ = 1;
    }
    else {
      d.ptr = buf + size;
      d.end = (char *)arena;
      d._32_8_ = status;
      d.line_begin._4_4_ = d.debug_field._4_4_;
      d.symtab._0_4_ = 0x40;
      d.symtab._4_4_ = 0;
      d.err[0].__saved_mask.__val[0xf]._0_4_ = 1;
      d.is_first = false;
      d._265_3_ = 0;
      d.options = 0;
      d.line_begin._0_1_ = 0;
      local_158 = (undefined1  [8])buf;
      d.arena = (upb_Arena *)symtab;
      d._248_8_ = buf;
      buf_local._4_4_ = upb_JsonDecoder_Decode((jsondec *)local_158,msg,m);
    }
    return buf_local._4_4_;
  }
  __assert_fail("!upb_Message_IsFrozen(msg)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                ,0x616,
                "int upb_JsonDecodeDetectingNonconformance(const char *, size_t, upb_Message *, const upb_MessageDef *, const upb_DefPool *, int, upb_Arena *, upb_Status *)"
               );
}

Assistant:

int upb_JsonDecodeDetectingNonconformance(const char* buf, size_t size,
                                          upb_Message* msg,
                                          const upb_MessageDef* m,
                                          const upb_DefPool* symtab,
                                          int options, upb_Arena* arena,
                                          upb_Status* status) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  jsondec d;

  if (size == 0) return true;

  d.ptr = buf;
  d.end = buf + size;
  d.arena = arena;
  d.symtab = symtab;
  d.status = status;
  d.options = options;
  d.depth = 64;
  d.result = kUpb_JsonDecodeResult_Ok;
  d.line = 1;
  d.line_begin = d.ptr;
  d.debug_field = NULL;
  d.is_first = false;

  return upb_JsonDecoder_Decode(&d, msg, m);
}